

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btBox2dShape.h
# Opt level: O0

void __thiscall
btBox2dShape::getPlane(btBox2dShape *this,btVector3 *planeNormal,btVector3 *planeSupport,int i)

{
  undefined8 uVar1;
  btScalar *_x;
  btScalar *_y;
  btScalar *_z;
  undefined4 in_ECX;
  undefined8 *in_RDX;
  btScalar *in_RSI;
  long *in_RDI;
  undefined8 uVar2;
  btVector3 bVar3;
  btVector4 plane;
  btVector3 *this_00;
  undefined8 local_5c;
  undefined8 local_54;
  btVector3 local_3c;
  btVector3 local_2c;
  undefined4 local_1c;
  undefined8 *local_18;
  btScalar *local_10;
  
  this_00 = &local_2c;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  btVector4::btVector4((btVector4 *)0x1a8579);
  (**(code **)(*in_RDI + 0xf8))(in_RDI,this_00,local_1c);
  _x = btVector3::getX(this_00);
  _y = btVector3::getY(this_00);
  _z = btVector3::getZ(this_00);
  btVector3::btVector3(&local_3c,_x,_y,_z);
  *(undefined8 *)local_10 = local_3c.m_floats._0_8_;
  *(undefined8 *)(local_10 + 2) = local_3c.m_floats._8_8_;
  bVar3 = operator-(this_00);
  uVar2 = bVar3.m_floats._8_8_;
  local_5c = bVar3.m_floats._0_8_;
  local_54 = uVar2;
  uVar1 = (**(code **)(*in_RDI + 0x80))(in_RDI,&local_5c);
  *local_18 = uVar1;
  local_18[1] = uVar2;
  return;
}

Assistant:

virtual void getPlane(btVector3& planeNormal,btVector3& planeSupport,int i ) const
	{
		//this plane might not be aligned...
		btVector4 plane ;
		getPlaneEquation(plane,i);
		planeNormal = btVector3(plane.getX(),plane.getY(),plane.getZ());
		planeSupport = localGetSupportingVertex(-planeNormal);
	}